

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptoperator.cpp
# Opt level: O0

void __thiscall
ScriptOperator_IsOpSuccess_Test::~ScriptOperator_IsOpSuccess_Test
          (ScriptOperator_IsOpSuccess_Test *this)

{
  ScriptOperator_IsOpSuccess_Test *this_local;
  
  ~ScriptOperator_IsOpSuccess_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(ScriptOperator, IsOpSuccess) {
  EXPECT_TRUE(ScriptOperator::IsOpSuccess(ScriptType::kOpSuccess137));
  EXPECT_TRUE(ScriptOperator::IsOpSuccess(ScriptType::kOpSuccess137, true));
  EXPECT_TRUE(ScriptOperator::IsOpSuccess(ScriptType::kOpSuccess192));
  EXPECT_FALSE(ScriptOperator::IsOpSuccess(ScriptType::kOpSuccess192, true));
  EXPECT_TRUE(ScriptOperator::IsOpSuccess(ScriptType::kOpSuccess195));
  EXPECT_TRUE(ScriptOperator::IsOpSuccess(ScriptType::kOpSuccess195, true));
}